

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_vif_linux.c
# Opt level: O0

int os_vif_linux_open(os_fd *sock,os_vif *vif)

{
  oonf_log_source oVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ushort local_98;
  int flag;
  int fd;
  ifreq if_req;
  os_vif *vif_local;
  os_fd *sock_local;
  
  if_req.ifr_ifru._16_8_ = vif;
  if (vif->type == OS_VIF_IP) {
    local_98 = 1;
  }
  else {
    if (vif->type != OS_VIF_MAC) {
      if (((&log_global_mask)[_oonf_os_vif_subsystem.logging] & 4) != 0) {
        oonf_log(4,_oonf_os_vif_subsystem.logging,"src/base/os_linux/os_vif_linux.c",0x79,0,0,
                 "Unknown vif type: %d",vif->type);
      }
      return -1;
    }
    local_98 = 2;
  }
  __fd = open("/dev/net/tun",2);
  oVar1 = _oonf_os_vif_subsystem.logging;
  if (__fd < 0) {
    if (((&log_global_mask)[_oonf_os_vif_subsystem.logging] & 4) != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      piVar3 = __errno_location();
      oonf_log(4,oVar1,"src/base/os_linux/os_vif_linux.c",0x7f,0,0,
               "Cannot open virtual interface device: %s (%d)",pcVar4,*piVar3);
    }
    sock_local._4_4_ = -1;
  }
  else {
    memset(&flag,0,0x28);
    strscpy(&flag,if_req.ifr_ifru._16_8_,0x10);
    if_req.ifr_ifrn._8_2_ = local_98 | 0x1000;
    iVar2 = ioctl(__fd,0x400454ca,&flag);
    oVar1 = _oonf_os_vif_subsystem.logging;
    if (iVar2 < 0) {
      if (((&log_global_mask)[_oonf_os_vif_subsystem.logging] & 4) != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        piVar3 = __errno_location();
        oonf_log(4,oVar1,"src/base/os_linux/os_vif_linux.c",0x8d,0,0,
                 "Cannot set mode of virtual interface device: %s (%d)",pcVar4,*piVar3);
      }
      close(__fd);
      sock_local._4_4_ = -1;
    }
    else {
      sock->fd = __fd;
      sock->_flags = OS_FD_ACTIVE;
      os_fd_generic_set_nonblocking(sock);
      *(undefined8 *)(if_req.ifr_ifru._16_8_ + 0x48) = if_req.ifr_ifru._16_8_;
      avl_insert(&_vif_tree,if_req.ifr_ifru._16_8_ + 0x20);
      sock_local._4_4_ = 0;
    }
  }
  return sock_local._4_4_;
}

Assistant:

int
os_vif_linux_open(struct os_fd *sock, struct os_vif *vif) {
  struct ifreq if_req;
  int fd, flag;

  switch (vif->type) {
    case OS_VIF_MAC:
      flag = IFF_TAP;
      break;
    case OS_VIF_IP:
      flag = IFF_TUN;
      break;
    default:
      OONF_WARN(LOG_OS_VIF, "Unknown vif type: %d", vif->type);
      return -1;
  }

  fd = open("/dev/net/tun", O_RDWR);
  if (fd < 0) {
    OONF_WARN(LOG_OS_VIF, "Cannot open virtual interface device: %s (%d)", strerror(errno), errno);
    return -1;
  }

  memset(&if_req, 0, sizeof(if_req));
  strscpy(if_req.ifr_name, vif->if_name, IF_NAMESIZE);

  /*
   * Specify the IFF_TAP flag for Ethernet packets.
   * Specify IFF_NO_PI for not receiving extra meta packet information.
   */
  if_req.ifr_flags = flag | IFF_NO_PI;

  if (ioctl(fd, TUNSETIFF, (void *)&if_req) < 0) {
    OONF_WARN(LOG_OS_VIF, "Cannot set mode of virtual interface device: %s (%d)", strerror(errno), errno);
    close(fd);
    return -1;
  }

  /* initialize OONF file descriptor */
  os_fd_init(sock, fd);
  os_fd_set_nonblocking(sock);

  /* initialize vif memory */
  vif->_vif_node.key = vif->if_name;
  avl_insert(&_vif_tree, &vif->_vif_node);

  return 0;
}